

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  _func_int ***ppp_Var4;
  bool bVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  Expr *pEVar9;
  code *func;
  TokenTypePair pair;
  char cVar10;
  iterator pos;
  iterator pos_00;
  ExprList new_exprs;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  ExprList local_48;
  
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  do {
    TVar6 = Peek(this,0);
    TVar7 = Peek(this,1);
    pair._M_elems[1] = TVar7;
    pair._M_elems[0] = TVar6;
    bVar5 = anon_unknown_1::IsInstr(pair);
    if (bVar5) {
      RVar8 = ParseInstr(this,&local_48);
      pEVar9 = local_48.first_;
      if (RVar8.enum_ == Ok) {
        while (pEVar9 != (Expr *)0x0) {
          if (local_48.size_ == 0) {
LAB_0018ade9:
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x221,
                          "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                         );
          }
          pEVar1 = (pEVar9->super_intrusive_list_base<wabt::Expr>).next_;
          if (local_48.first_ == local_48.last_) {
            local_48.first_ = (Expr *)0x0;
            local_48.last_ = (Expr *)0x0;
            pEVar2 = local_48.last_;
          }
          else {
            pEVar2 = (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_;
            pEVar3 = pEVar1;
            if (pEVar2 != (Expr *)0x0) {
              (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = pEVar1;
              pEVar3 = local_48.first_;
            }
            local_48.first_ = pEVar3;
            pEVar3 = (pEVar9->super_intrusive_list_base<wabt::Expr>).next_;
            if (pEVar3 != (Expr *)0x0) {
              (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
              pEVar2 = local_48.last_;
            }
          }
          local_48.last_ = pEVar2;
          local_48.size_ = local_48.size_ - 1;
          (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          pos.node_ = (Expr *)0x0;
          pos.list_ = exprs;
          local_50._M_head_impl = pEVar9;
          intrusive_list<wabt::Expr>::insert
                    (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50
                    );
          if (local_50._M_head_impl != (Expr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          pEVar9 = pEVar1;
        }
LAB_0018ada4:
        cVar10 = '\0';
      }
      else {
        func = anon_unknown_1::IsInstr;
LAB_0018ac48:
        RVar8 = Synchronize(this,func);
        cVar10 = RVar8.enum_ == Error;
      }
    }
    else {
      cVar10 = '\x03';
      if (TVar6 == LparAnn) {
        RVar8 = ParseCodeMetadataAnnotation(this,&local_48);
        pEVar9 = local_48.first_;
        if (RVar8.enum_ == Ok) {
          while (pEVar9 != (Expr *)0x0) {
            if (local_48.size_ == 0) goto LAB_0018ade9;
            pEVar1 = (pEVar9->super_intrusive_list_base<wabt::Expr>).next_;
            if (local_48.first_ == local_48.last_) {
              local_48.first_ = (Expr *)0x0;
              local_48.last_ = (Expr *)0x0;
              pEVar2 = local_48.last_;
            }
            else {
              pEVar2 = (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_;
              pEVar3 = pEVar1;
              if (pEVar2 != (Expr *)0x0) {
                (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = pEVar1;
                pEVar3 = local_48.first_;
              }
              local_48.first_ = pEVar3;
              pEVar3 = (pEVar9->super_intrusive_list_base<wabt::Expr>).next_;
              if (pEVar3 != (Expr *)0x0) {
                (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
                pEVar2 = local_48.last_;
              }
            }
            local_48.last_ = pEVar2;
            local_48.size_ = local_48.size_ - 1;
            (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
            (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
            pos_00.node_ = (Expr *)0x0;
            pos_00.list_ = exprs;
            local_50._M_head_impl = pEVar9;
            intrusive_list<wabt::Expr>::insert
                      (exprs,pos_00,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
            if (local_50._M_head_impl != (Expr *)0x0) {
              (*(local_50._M_head_impl)->_vptr_Expr[1])();
            }
            local_50._M_head_impl = (Expr *)0x0;
            pEVar9 = pEVar1;
          }
          goto LAB_0018ada4;
        }
        func = anon_unknown_1::IsLparAnn;
        goto LAB_0018ac48;
      }
    }
    if (cVar10 != '\0') {
      pEVar9 = local_48.first_;
      while (pEVar9 != (Expr *)0x0) {
        ppp_Var4 = &pEVar9->_vptr_Expr;
        pEVar9 = (pEVar9->super_intrusive_list_base<wabt::Expr>).next_;
        (*(*ppp_Var4)[1])();
      }
      return (Result)(uint)(cVar10 != '\x03');
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (true) {
    auto pair = PeekPair();
    if (IsInstr(pair)) {
      if (Succeeded(ParseInstr(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsInstr));
      }
    } else if (IsLparAnn(pair)) {
      if (Succeeded(ParseCodeMetadataAnnotation(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsLparAnn));
      }
    } else {
      break;
    }
  }
  return Result::Ok;
}